

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O3

void info_print_input(lyout *out,lys_node *node,int *UNUSED_first)

{
  lys_node *plVar1;
  
  plVar1 = lys_parent(node);
  if (plVar1 != (lys_node *)0x0) {
    plVar1 = lys_parent(node);
    if (plVar1->nodetype == LYS_RPC) {
      plVar1 = lys_parent(node);
      ly_print(out,"%-*s%s\n",0xb,"Input of: ",plVar1->name);
      info_print_typedef(out,*(lys_tpdf **)node->hash,node->padding[2]);
      info_print_must(out,(lys_restr *)node[1].name,node->padding[1]);
      info_print_snode(out,node,node->child,"Children:");
      return;
    }
  }
  __assert_fail("lys_parent(node) && lys_parent(node)->nodetype == LYS_RPC",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_info.c"
                ,0x3b0,"void info_print_input(struct lyout *, const struct lys_node *, int *)");
}

Assistant:

static void
info_print_input(struct lyout *out, const struct lys_node *node, int *UNUSED(first))
{
    struct lys_node_inout *input = (struct lys_node_inout *)node;

    assert(lys_parent(node) && lys_parent(node)->nodetype == LYS_RPC);

    ly_print(out, "%-*s%s\n", INDENT_LEN, "Input of: ", lys_parent(node)->name);
    info_print_typedef(out, input->tpdf, input->tpdf_size);
    info_print_must(out, input->must, input->must_size);

    info_print_snode(out, (struct lys_node *)input, input->child, "Children:");
}